

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void checkPropertyConsistency<char_const*>
               (cmGeneratorTarget *depender,cmGeneratorTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,char **param_7)

{
  cmLocalGenerator *this;
  bool bVar1;
  cmValue cVar2;
  string *psVar3;
  long *plVar4;
  string *psVar5;
  ostream *poVar6;
  size_type *psVar7;
  pointer __v;
  string_view str;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string pfile;
  string pname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string pdir;
  ostringstream e;
  string local_258;
  string *local_238;
  cmGeneratorTarget *local_230;
  string local_228;
  cmGeneratorTarget *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  psVar5 = config;
  local_230 = depender;
  cVar2 = cmGeneratorTarget::GetProperty(dependee,propName);
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&local_200,arg,false);
    psVar3 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    psVar7 = (size_type *)(psVar3->_M_dataplus)._M_p;
    local_1a8._0_8_ = psVar3->_M_string_length;
    local_198._0_8_ = 0xf;
    local_198._8_8_ = "/Help/prop_tgt/";
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    local_238 = propName;
    local_208 = dependee;
    local_1a8._8_8_ = psVar7;
    cmCatViews_abi_cxx11_(&local_1c8,views);
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __v = local_200.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        str._M_str = (char *)psVar7;
        str._M_len = (size_t)(__v->_M_dataplus)._M_p;
        cmSystemTools::HelpFileName_abi_cxx11_
                  (&local_228,(cmSystemTools *)__v->_M_string_length,str);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_1c8,&local_228);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_1a8);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_258.field_2._M_allocated_capacity = *psVar7;
          local_258.field_2._8_8_ = plVar4[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar7;
          local_258._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_258._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((undefined1 *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
        bVar1 = cmsys::SystemTools::FileExists(&local_258,true);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          psVar5 = cmTarget::GetName_abi_cxx11_(local_208->Target);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,
                              psVar5->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" has property \"",0x10);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(__v->_M_dataplus)._M_p,__v->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" listed in its ",0x10);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(local_238->_M_dataplus)._M_p,local_238->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                     ,0x58);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(local_238->_M_dataplus)._M_p,local_238->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," property.",10);
          this = local_230->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
LAB_00459f66:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        pVar8 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)emitted,__v);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar7 = (size_type *)(ulong)t;
          getLinkInterfaceDependentProperty<char_const*>(local_230,__v,config,t,(char **)psVar5);
          if (((cmSystemTools::s_ErrorOccurred != false) ||
              (cmSystemTools::s_FatalErrorOccurred != false)) ||
             (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)) goto LAB_00459f66;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        __v = __v + 1;
      } while (__v != local_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_200);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmGeneratorTarget const* depender,
                              cmGeneratorTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string>& emitted,
                              const std::string& config, CompatibleType t,
                              PropertyType* /*unused*/)
{
  cmValue prop = dependee->GetProperty(propName);
  if (!prop) {
    return;
  }

  std::vector<std::string> props = cmExpandedList(*prop);
  std::string pdir =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Help/prop_tgt/");

  for (std::string const& p : props) {
    std::string pname = cmSystemTools::HelpFileName(p);
    std::string pfile = pdir + pname + ".rst";
    if (cmSystemTools::FileExists(pfile, true)) {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \"" << p
        << "\" listed in its " << propName
        << " property.  "
           "This is not allowed.  Only user-defined properties may appear "
           "listed in the "
        << propName << " property.";
      depender->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str());
      return;
    }
    if (emitted.insert(p).second) {
      getLinkInterfaceDependentProperty<PropertyType>(depender, p, config, t,
                                                      nullptr);
      if (cmSystemTools::GetErrorOccurredFlag()) {
        return;
      }
    }
  }
}